

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

internals * pybind11::detail::get_internals(void)

{
  PyTypeObject *pPVar1;
  bool bVar2;
  int iVar3;
  object *poVar4;
  internals *piVar5;
  long lVar6;
  _Fwd_list_node_base *p_Var7;
  char *id;
  handle builtins;
  handle local_58;
  item_accessor local_50;
  char *local_30;
  undefined8 local_28;
  object local_20;
  
  if (get_internals::internals_ptr == (internals *)0x0) {
    local_28 = PyEval_GetBuiltins();
    local_30 = "__pybind11_2_1__";
    bVar2 = object_api<pybind11::handle>::contains<char_const*&>
                      ((object_api<pybind11::handle> *)&local_28,&local_30);
    if (bVar2) {
      object_api<pybind11::handle>::operator[]
                (&local_50,(object_api<pybind11::handle> *)&local_28,local_30);
      poVar4 = accessor<pybind11::detail::accessor_policies::generic_item>::get_cache(&local_50);
      local_58.m_ptr = (poVar4->super_handle).m_ptr;
      if (local_58.m_ptr == (PyObject *)0x0) {
        pybind11::object::~object((object *)&local_58);
        pybind11::object::~object(&local_50.cache);
        pybind11::object::~object(&local_50.key);
      }
      else {
        (local_58.m_ptr)->ob_refcnt = (local_58.m_ptr)->ob_refcnt + 1;
        pPVar1 = (local_58.m_ptr)->ob_type;
        pybind11::object::~object((object *)&local_58);
        pybind11::object::~object(&local_50.cache);
        pybind11::object::~object(&local_50.key);
        if (pPVar1 == (PyTypeObject *)&PyCapsule_Type) {
          object_api<pybind11::handle>::operator[]
                    (&local_50,(object_api<pybind11::handle> *)&local_28,local_30);
          poVar4 = accessor<pybind11::detail::accessor_policies::generic_item>::get_cache(&local_50)
          ;
          local_58.m_ptr = (poVar4->super_handle).m_ptr;
          if (local_58.m_ptr != (PyObject *)0x0) {
            (local_58.m_ptr)->ob_refcnt = (local_58.m_ptr)->ob_refcnt + 1;
          }
          local_20.super_handle.m_ptr = (handle)(PyObject *)0x0;
          get_internals::internals_ptr = capsule::operator_cast_to_internals_((capsule *)&local_58);
          pybind11::object::~object((object *)&local_58);
          pybind11::object::~object(&local_20);
          pybind11::object::~object(&local_50.cache);
          pybind11::object::~object(&local_50.key);
          return get_internals::internals_ptr;
        }
      }
    }
    piVar5 = (internals *)operator_new(0x168);
    memset(&(piVar5->registered_types_cpp)._M_h._M_rehash_policy,0,0x140);
    (piVar5->registered_types_cpp)._M_h._M_buckets =
         &(piVar5->registered_types_cpp)._M_h._M_single_bucket;
    (piVar5->registered_types_cpp)._M_h._M_bucket_count = 1;
    (piVar5->registered_types_cpp)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (piVar5->registered_types_cpp)._M_h._M_element_count = 0;
    (piVar5->registered_types_cpp)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (piVar5->registered_types_cpp)._M_h._M_rehash_policy._M_next_resize = 0;
    (piVar5->registered_types_cpp)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    (piVar5->registered_types_py)._M_h._M_buckets =
         &(piVar5->registered_types_py)._M_h._M_single_bucket;
    (piVar5->registered_types_py)._M_h._M_bucket_count = 1;
    (piVar5->registered_types_py)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (piVar5->registered_types_py)._M_h._M_element_count = 0;
    (piVar5->registered_types_py)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (piVar5->registered_types_py)._M_h._M_rehash_policy._M_next_resize = 0;
    (piVar5->registered_types_py)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    (piVar5->registered_instances)._M_h._M_buckets =
         &(piVar5->registered_instances)._M_h._M_single_bucket;
    (piVar5->registered_instances)._M_h._M_bucket_count = 1;
    (piVar5->registered_instances)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (piVar5->registered_instances)._M_h._M_element_count = 0;
    (piVar5->registered_instances)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (piVar5->registered_instances)._M_h._M_rehash_policy._M_next_resize = 0;
    (piVar5->registered_instances)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    (piVar5->inactive_overload_cache)._M_h._M_buckets =
         &(piVar5->inactive_overload_cache)._M_h._M_single_bucket;
    (piVar5->inactive_overload_cache)._M_h._M_bucket_count = 1;
    (piVar5->inactive_overload_cache)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (piVar5->inactive_overload_cache)._M_h._M_element_count = 0;
    (piVar5->inactive_overload_cache)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (piVar5->inactive_overload_cache)._M_h._M_rehash_policy._M_next_resize = 0;
    (piVar5->inactive_overload_cache)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    (piVar5->direct_conversions)._M_h._M_buckets =
         &(piVar5->direct_conversions)._M_h._M_single_bucket;
    (piVar5->direct_conversions)._M_h._M_bucket_count = 1;
    (piVar5->direct_conversions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (piVar5->direct_conversions)._M_h._M_element_count = 0;
    (piVar5->direct_conversions)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (piVar5->registered_exception_translators).
    super__Fwd_list_base<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
    ._M_impl._M_head._M_next = (_Fwd_list_node_base *)0x0;
    (piVar5->direct_conversions)._M_h._M_rehash_policy._M_next_resize = 0;
    (piVar5->direct_conversions)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    (piVar5->shared_data)._M_h._M_buckets = &(piVar5->shared_data)._M_h._M_single_bucket;
    (piVar5->shared_data)._M_h._M_bucket_count = 1;
    (piVar5->shared_data)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (piVar5->shared_data)._M_h._M_element_count = 0;
    (piVar5->shared_data)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    piVar5->istate = (PyInterpreterState *)0x0;
    (piVar5->shared_data)._M_h._M_rehash_policy._M_next_resize = 0;
    (piVar5->shared_data)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    piVar5->tstate = 0;
    get_internals::internals_ptr = piVar5;
    PyEval_InitThreads();
    lVar6 = PyThreadState_Get();
    iVar3 = PyThread_create_key();
    get_internals::internals_ptr->tstate = iVar3;
    PyThread_set_key_value(iVar3,lVar6);
    piVar5 = get_internals::internals_ptr;
    get_internals::internals_ptr->istate = *(PyInterpreterState **)(lVar6 + 0x10);
    capsule::capsule((capsule *)&local_58,piVar5,(_func_void_PyObject_ptr *)0x0);
    object_api<pybind11::handle>::operator[]
              (&local_50,(object_api<pybind11::handle> *)&local_28,local_30);
    accessor_policies::generic_item::set(local_50.obj,local_50.key.super_handle,local_58);
    pybind11::object::~object(&local_50.cache);
    pybind11::object::~object(&local_50.key);
    pybind11::object::~object((object *)&local_58);
    piVar5 = get_internals::internals_ptr;
    p_Var7 = (_Fwd_list_node_base *)operator_new(0x10);
    p_Var7[1]._M_next =
         (_Fwd_list_node_base *)
         get_internals()::{lambda(std::__exception_ptr::exception_ptr)#1}::exception_ptr_;
    p_Var7->_M_next =
         (piVar5->registered_exception_translators).
         super__Fwd_list_base<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
         ._M_impl._M_head._M_next;
    (piVar5->registered_exception_translators).
    super__Fwd_list_base<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
    ._M_impl._M_head._M_next = p_Var7;
  }
  return get_internals::internals_ptr;
}

Assistant:

PYBIND11_NOINLINE inline internals &get_internals() {
    static internals *internals_ptr = nullptr;
    if (internals_ptr)
        return *internals_ptr;
    handle builtins(PyEval_GetBuiltins());
    const char *id = PYBIND11_INTERNALS_ID;
    if (builtins.contains(id) && isinstance<capsule>(builtins[id])) {
        internals_ptr = capsule(builtins[id]);
    } else {
        internals_ptr = new internals();
        #if defined(WITH_THREAD)
            PyEval_InitThreads();
            PyThreadState *tstate = PyThreadState_Get();
            internals_ptr->tstate = PyThread_create_key();
            PyThread_set_key_value(internals_ptr->tstate, tstate);
            internals_ptr->istate = tstate->interp;
        #endif
        builtins[id] = capsule(internals_ptr);
        internals_ptr->registered_exception_translators.push_front(
            [](std::exception_ptr p) -> void {
                try {
                    if (p) std::rethrow_exception(p);
                } catch (error_already_set &e)           { e.restore();                                    return;
                } catch (const builtin_exception &e)     { e.set_error();                                  return;
                } catch (const std::bad_alloc &e)        { PyErr_SetString(PyExc_MemoryError,   e.what()); return;
                } catch (const std::domain_error &e)     { PyErr_SetString(PyExc_ValueError,    e.what()); return;
                } catch (const std::invalid_argument &e) { PyErr_SetString(PyExc_ValueError,    e.what()); return;
                } catch (const std::length_error &e)     { PyErr_SetString(PyExc_ValueError,    e.what()); return;
                } catch (const std::out_of_range &e)     { PyErr_SetString(PyExc_IndexError,    e.what()); return;
                } catch (const std::range_error &e)      { PyErr_SetString(PyExc_ValueError,    e.what()); return;
                } catch (const std::exception &e)        { PyErr_SetString(PyExc_RuntimeError,  e.what()); return;
                } catch (...) {
                    PyErr_SetString(PyExc_RuntimeError, "Caught an unknown exception!");
                    return;
                }
            }
        );
    }
    return *internals_ptr;
}